

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O3

void av1_block_yrd(MACROBLOCK *x,RD_STATS *this_rdc,int *skippable,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  byte bVar1;
  byte bVar2;
  undefined8 extraout_RAX;
  undefined8 uVar3;
  int16_t *piVar4;
  int16_t *piVar5;
  int64_t iVar6;
  ulong uVar7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  undefined7 in_register_00000009;
  int16_t *piVar11;
  ulong uVar12;
  int16_t *piVar13;
  int iVar14;
  intptr_t iVar15;
  int iVar16;
  undefined7 in_register_00000081;
  tran_low_t *ptVar17;
  uint uVar18;
  long lVar19;
  MACROBLOCK *pMVar20;
  bool bVar21;
  uint16_t eob [1];
  macroblock_plane *p;
  tran_low_t qcoeff_buf [256];
  tran_low_t dqcoeff_buf [256];
  tran_low_t coeff_buf [256];
  int16_t *piVar22;
  int16_t *piVar23;
  int16_t *piVar24;
  ushort local_d4a;
  uint local_d48;
  uint local_d44;
  MACROBLOCK *local_d40;
  tran_low_t *local_d38;
  RD_STATS *local_d30;
  uint local_d28;
  uint local_d24;
  uint *local_d20;
  ulong local_d18;
  uint8_t *local_d10;
  int local_d04;
  undefined4 local_d00;
  int local_cfc;
  ulong local_cf8;
  long local_cf0;
  long local_ce8;
  ulong local_ce0;
  long local_cd8;
  ulong local_cd0;
  ulong local_cc8;
  ulong local_cc0;
  int local_cb4;
  SCAN_ORDER (*local_cb0) [16];
  ulong local_ca8;
  ulong local_ca0;
  long local_c98;
  long local_c90;
  int64_t local_c88;
  int local_c80 [256];
  tran_low_t local_880 [256];
  tran_low_t local_480 [276];
  
  uVar12 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar12];
  local_cf8 = (ulong)bVar1;
  local_d24 = (uint)CONCAT71(in_register_00000081,tx_size);
  bVar8 = (byte)(local_d24 * 2);
  local_cfc = 1 << (bVar8 & 0x1f);
  local_d44 = 1 << (tx_size & 0x1f);
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar12];
  iVar16 = (x->e_mbd).mb_to_right_edge;
  iVar14 = (x->e_mbd).mb_to_bottom_edge;
  local_ce0 = CONCAT44(local_ce0._4_4_,local_d24 * 2);
  local_d04 = (int)((uint)bVar1 << (bVar8 & 0x1f)) >> (tx_size & 0x1f);
  local_cd8 = (long)(iVar16 >> 0x1f & iVar16 >> 5) + local_cf8;
  local_d48 = ((x->e_mbd).cur_buf)->flags;
  uVar10 = (uint)bVar1 * 4;
  local_ca8 = (ulong)uVar10;
  iVar16 = (uint)bVar2 * 4;
  uVar12 = (ulong)uVar10;
  local_d40 = x;
  local_d20 = (uint *)skippable;
  if ((local_d48 & 8) == 0) {
    uVar3 = (*aom_subtract_block)
                      (iVar16,uVar10,x->plane[0].src_diff,uVar12,x->plane[0].src.buf,
                       (long)x->plane[0].src.stride,(x->e_mbd).plane[0].dst.buf,
                       (long)(x->e_mbd).plane[0].dst.stride);
  }
  else {
    aom_highbd_subtract_block_sse2
              (iVar16,uVar10,x->plane[0].src_diff,local_ca8,x->plane[0].src.buf,
               (long)x->plane[0].src.stride,(x->e_mbd).plane[0].dst.buf,
               (long)(x->e_mbd).plane[0].dst.stride);
    uVar3 = extraout_RAX;
  }
  local_d28 = (iVar14 >> 0x1f & iVar14 >> 5) + (uint)bVar2;
  local_ca0 = (ulong)local_d28;
  this_rdc->dist = 0;
  this_rdc->rate = 0;
  local_d00 = (undefined4)CONCAT71((int7)((ulong)uVar3 >> 8),1);
  local_cd0 = uVar12;
  if (((((byte)local_d24 == '\x01') && ((0x3affe0UL >> ((ulong)bsize & 0x3f) & 1) != 0)) &&
      ((local_d48 & 8) == 0)) && ((0x3dfffaUL >> ((ulong)bsize & 0x3f) & 1) != 0)) {
    local_d30 = this_rdc;
    if (0 < (int)local_d28) {
      iVar14 = (int)local_cf8;
      iVar16 = (int)local_cd8;
      if (iVar14 < (int)local_cd8) {
        iVar16 = iVar14;
      }
      local_d18 = CONCAT44(local_d18._4_4_,iVar16);
      local_ce8 = (long)iVar16;
      local_d38 = (tran_low_t *)(ulong)local_d44;
      local_d10 = (uint8_t *)(ulong)local_d28;
      local_cf0 = CONCAT44(local_cf0._4_4_,local_d44 * iVar14 * 0x10);
      uVar7 = 0;
      uVar12 = 0;
      iVar16 = 0;
      do {
        local_cc8 = uVar12;
        local_cc0 = uVar7;
        if (0 < (int)local_d18) {
          iVar14 = iVar16 << 4;
          lVar19 = 0;
          do {
            (*aom_hadamard_lp_8x8_dual)
                      (local_d40->plane[0].src_diff + (int)uVar7,local_cd0,
                       (int16_t *)((long)iVar14 * 2 + (long)local_d40->plane[0].coeff));
            lVar19 = lVar19 + 4;
            uVar7 = (ulong)((int)uVar7 + 0x10);
            iVar16 = iVar16 + 8;
            iVar14 = iVar14 + 0x80;
          } while (lVar19 < local_ce8);
        }
        uVar12 = local_cc8 + (long)local_d38;
        uVar7 = (ulong)(uint)((int)local_cc0 + (int)local_cf0);
      } while (uVar12 < local_d10);
      local_d00 = 0;
      local_ca0 = (ulong)local_d28;
      this_rdc = local_d30;
      goto LAB_00222b7d;
    }
  }
  else {
LAB_00222b7d:
    local_d30 = this_rdc;
    if (0 < (int)local_ca0) {
      local_d28 = local_d24 & 0xff;
      local_cb0 = av1_scan_orders + (byte)local_d24;
      local_d18 = (ulong)(uint)(0x10 << ((byte)local_ce0 & 0x1f));
      local_d10 = (local_d40->txfm_search_info).blk_skip;
      local_cf0 = (long)(int)local_d44;
      local_c98 = (local_cf8 & 0xffffffff) * local_cf0;
      local_cf8 = (ulong)((int)local_cf8 * local_d44 * 0x10);
      local_d44 = local_d44 << 2;
      local_d04 = local_d04 << 4;
      local_cfc = local_cfc << 4;
      uVar18 = 1;
      local_d38 = local_480;
      uVar10 = 0;
      iVar14 = 0;
      local_c90 = 0;
      iVar16 = 0;
      uVar12 = local_cd0;
      pMVar20 = local_d40;
      do {
        uVar7 = (ulong)uVar10;
        local_ce0 = uVar7;
        local_cb4 = iVar14;
        if (0 < (int)local_cd8) {
          lVar19 = 0;
          do {
            ptVar17 = local_d38;
            piVar11 = pMVar20->plane[0].src_diff + iVar14;
            local_ce8 = CONCAT44(local_ce8._4_4_,uVar18);
            local_cc0 = CONCAT44(local_cc0._4_4_,iVar16);
            local_cc8 = CONCAT44(local_cc8._4_4_,(int)uVar7);
            if ((byte)local_d24 == '\x01') {
              if ((local_d48 & 8) != 0) {
                aom_hadamard_8x8_sse2(piVar11,uVar12,local_480);
                piVar11 = pMVar20->plane[0].zbin_QTX;
                piVar13 = pMVar20->plane[0].quant_fp_QTX;
                piVar5 = pMVar20->plane[0].round_fp_QTX;
                piVar24 = pMVar20->plane[0].quant_shift_QTX;
                iVar15 = 0x40;
                piVar23 = av1_default_iscan_8x8_transpose;
                piVar4 = default_scan_8x8_transpose;
                goto LAB_00222d1d;
              }
              if ((char)local_d00 == '\0') {
                ptVar17 = (tran_low_t *)((long)(int)uVar7 * 2 + (long)pMVar20->plane[0].coeff);
              }
              else {
                aom_hadamard_lp_8x8_sse2(piVar11,uVar12,(int16_t *)local_d38);
              }
              piVar11 = pMVar20->plane[0].quant_fp_QTX;
              piVar13 = pMVar20->plane[0].round_fp_QTX;
              iVar15 = 0x40;
              piVar24 = av1_default_iscan_8x8_transpose;
              piVar5 = default_scan_8x8_transpose;
              local_d38 = ptVar17;
LAB_00222f8d:
              piVar4 = pMVar20->plane[0].dequant_QTX;
LAB_00222f9b:
              (*av1_quantize_lp)((int16_t *)ptVar17,iVar15,piVar13,piVar11,(int16_t *)local_c80,
                                 (int16_t *)local_880,piVar4,&local_d4a,piVar5,piVar24);
              bVar21 = local_d4a == 0;
              local_d10[lVar19] = bVar21;
              uVar10 = (uint)local_d4a;
              if (!bVar21) {
                if (uVar10 == 1) {
                  uVar9 = -(ushort)local_c80[0];
                  if (0 < (short)(ushort)local_c80[0]) {
                    uVar9 = (ushort)local_c80[0];
                  }
                  uVar18 = (uint)uVar9;
                }
                else {
                  uVar18 = (*aom_satd_lp)((int16_t *)local_c80,(int)local_d18);
                }
                local_d30->rate = local_d30->rate + uVar18;
              }
              uVar18 = (uint)local_ce8 & bVar21;
              uVar10 = uVar10 + 1;
              iVar16 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                }
              }
              iVar6 = (*av1_block_error_lp)((int16_t *)local_d38,(int16_t *)local_880,local_d18);
              local_d30->dist = local_d30->dist + (iVar6 >> 2);
              pMVar20 = local_d40;
            }
            else {
              if (local_d28 == 2) {
                if ((local_d48 & 8) == 0) {
                  (*aom_hadamard_lp_16x16)(piVar11,uVar12,(int16_t *)local_d38);
                  piVar11 = pMVar20->plane[0].quant_fp_QTX;
                  piVar13 = pMVar20->plane[0].round_fp_QTX;
                  iVar15 = 0x100;
                  piVar24 = av1_default_iscan_lp_16x16_transpose;
                  piVar5 = default_scan_lp_16x16_transpose;
                  goto LAB_00222f8d;
                }
                (*aom_hadamard_16x16)(piVar11,uVar12,local_480);
                piVar11 = pMVar20->plane[0].zbin_QTX;
                piVar13 = pMVar20->plane[0].quant_fp_QTX;
                piVar5 = pMVar20->plane[0].round_fp_QTX;
                piVar24 = pMVar20->plane[0].quant_shift_QTX;
                iVar15 = 0x100;
                piVar23 = av1_default_iscan_fp_16x16_transpose;
                piVar4 = default_scan_fp_16x16_transpose;
LAB_00222d1d:
                piVar22 = pMVar20->plane[0].dequant_QTX;
              }
              else {
                if ((local_d48 & 8) == 0) {
                  aom_fdct4x4_lp_sse2(piVar11,(int16_t *)local_d38,(int)local_ca8);
                  piVar11 = pMVar20->plane[0].quant_fp_QTX;
                  piVar13 = pMVar20->plane[0].round_fp_QTX;
                  piVar4 = pMVar20->plane[0].dequant_QTX;
                  piVar5 = (*local_cb0)[0].scan;
                  piVar24 = (*local_cb0)[0].iscan;
                  iVar15 = 0x10;
                  goto LAB_00222f9b;
                }
                aom_fdct4x4_sse2(piVar11,local_480,(int)local_ca8);
                piVar11 = pMVar20->plane[0].zbin_QTX;
                piVar13 = pMVar20->plane[0].quant_fp_QTX;
                piVar5 = pMVar20->plane[0].round_fp_QTX;
                piVar24 = pMVar20->plane[0].quant_shift_QTX;
                piVar22 = pMVar20->plane[0].dequant_QTX;
                piVar4 = (*local_cb0)[0].scan;
                piVar23 = (*local_cb0)[0].iscan;
                iVar15 = 0x10;
              }
              (*av1_quantize_fp)(local_480,iVar15,piVar11,piVar5,piVar13,piVar24,local_c80,local_880
                                 ,piVar22,&local_d4a,piVar4,piVar23);
              bVar21 = local_d4a == 0;
              local_d10[lVar19] = bVar21;
              uVar10 = (uint)local_d4a;
              if (!bVar21) {
                if (uVar10 == 1) {
                  iVar16 = -local_c80[0];
                  if (0 < local_c80[0]) {
                    iVar16 = local_c80[0];
                  }
                }
                else {
                  iVar16 = (*aom_satd)(local_c80,(int)local_d18);
                }
                local_d30->rate = local_d30->rate + iVar16;
              }
              pMVar20 = local_d40;
              uVar18 = (uint)local_ce8 & bVar21;
              uVar10 = uVar10 + 1;
              iVar16 = 0x1f;
              if (uVar10 != 0) {
                for (; uVar10 >> iVar16 == 0; iVar16 = iVar16 + -1) {
                }
              }
              iVar6 = (*av1_highbd_block_error)
                                (local_480,local_880,local_d18,&local_c88,(local_d40->e_mbd).bd);
              local_d30->dist = local_d30->dist + (iVar6 >> 2);
            }
            iVar16 = (int)local_cc0 + iVar16;
            lVar19 = lVar19 + local_cf0;
            iVar14 = iVar14 + local_d44;
            uVar7 = (ulong)(uint)((int)local_cc8 + local_cfc);
            uVar12 = local_cd0;
          } while (lVar19 < local_cd8);
        }
        local_c90 = local_c90 + local_cf0;
        local_d10 = local_d10 + local_c98;
        iVar14 = local_cb4 + (int)local_cf8;
        uVar10 = (int)local_ce0 + local_d04;
      } while (local_c90 < (long)local_ca0);
      iVar16 = iVar16 << 9;
      goto LAB_0022322a;
    }
  }
  uVar18 = 1;
  iVar16 = 0;
LAB_0022322a:
  *local_d20 = uVar18;
  local_d30->skip_txfm = (uint8_t)uVar18;
  if (local_d30->sse != 0x7fffffffffffffff) {
    lVar19 = (local_d30->sse << 6) >> 2;
    local_d30->sse = lVar19;
    if (uVar18 != 0) {
      local_d30->dist = lVar19;
      return;
    }
  }
  local_d30->rate = local_d30->rate * 0x800 + iVar16;
  return;
}

Assistant:

void av1_block_yrd(MACROBLOCK *x, RD_STATS *this_rdc, int *skippable,
                   BLOCK_SIZE bsize, TX_SIZE tx_size) {
  MACROBLOCKD *xd = &x->e_mbd;
  const struct macroblockd_plane *pd = &xd->plane[AOM_PLANE_Y];
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  assert(bsize < BLOCK_SIZES_ALL);
  const int num_4x4_w = mi_size_wide[bsize];
  const int num_4x4_h = mi_size_high[bsize];
  const int step = 1 << (tx_size << 1);
  const int block_step = (1 << tx_size);
  const int row_step = step * num_4x4_w >> tx_size;
  int block = 0;
  const int max_blocks_wide =
      num_4x4_w + (xd->mb_to_right_edge >= 0 ? 0 : xd->mb_to_right_edge >> 5);
  const int max_blocks_high =
      num_4x4_h + (xd->mb_to_bottom_edge >= 0 ? 0 : xd->mb_to_bottom_edge >> 5);
  int eob_cost = 0;
  const int bw = 4 * num_4x4_w;
  const int bh = 4 * num_4x4_h;
  const int use_hbd = is_cur_buf_hbd(xd);
  int num_blk_skip_w = num_4x4_w;

#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd) {
    aom_highbd_subtract_block(bh, bw, p->src_diff, bw, p->src.buf,
                              p->src.stride, pd->dst.buf, pd->dst.stride);
  } else {
    aom_subtract_block(bh, bw, p->src_diff, bw, p->src.buf, p->src.stride,
                       pd->dst.buf, pd->dst.stride);
  }
#else
  aom_subtract_block(bh, bw, p->src_diff, bw, p->src.buf, p->src.stride,
                     pd->dst.buf, pd->dst.stride);
#endif

  // Keep the intermediate value on the stack here. Writing directly to
  // skippable causes speed regression due to load-and-store issues in
  // update_yrd_loop_vars.
  int temp_skippable = 1;
  this_rdc->dist = 0;
  this_rdc->rate = 0;
  // For block sizes 8x16 or above, Hadamard txfm of two adjacent 8x8 blocks
  // can be done per function call. Hence the call of Hadamard txfm is
  // abstracted here for the specified cases.
  int is_tx_8x8_dual_applicable =
      (tx_size == TX_8X8 && block_size_wide[bsize] >= 16 &&
       block_size_high[bsize] >= 8);

#if CONFIG_AV1_HIGHBITDEPTH
  // As of now, dual implementation of hadamard txfm is available for low
  // bitdepth.
  if (use_hbd) is_tx_8x8_dual_applicable = 0;
#endif

  if (is_tx_8x8_dual_applicable) {
    aom_process_hadamard_lp_8x16(x, max_blocks_high, max_blocks_wide, num_4x4_w,
                                 step, block_step);
  }

  const SCAN_ORDER *const scan_order = &av1_scan_orders[tx_size][DCT_DCT];
  DECLARE_BLOCK_YRD_BUFFERS()
  DECLARE_BLOCK_YRD_VARS()
#if CONFIG_AV1_HIGHBITDEPTH
  DECLARE_BLOCK_YRD_HBD_VARS()
#else
  (void)use_hbd;
#endif

  // Keep track of the row and column of the blocks we use so that we know
  // if we are in the unrestricted motion border.
  for (int r = 0; r < max_blocks_high; r += block_step) {
    for (int c = 0, s = 0; c < max_blocks_wide; c += block_step, s += step) {
      DECLARE_LOOP_VARS_BLOCK_YRD()

      switch (tx_size) {
#if CONFIG_AV1_HIGHBITDEPTH
        case TX_16X16:
          if (use_hbd) {
            aom_hadamard_16x16(src_diff, diff_stride, coeff);
            av1_quantize_fp(coeff, 16 * 16, p->zbin_QTX, p->round_fp_QTX,
                            p->quant_fp_QTX, p->quant_shift_QTX, qcoeff,
                            dqcoeff, p->dequant_QTX, eob,
                            // default_scan_fp_16x16_transpose and
                            // av1_default_iscan_fp_16x16_transpose have to be
                            // used together.
                            default_scan_fp_16x16_transpose,
                            av1_default_iscan_fp_16x16_transpose);
          } else {
            aom_hadamard_lp_16x16(src_diff, diff_stride, low_coeff);
            av1_quantize_lp(low_coeff, 16 * 16, p->round_fp_QTX,
                            p->quant_fp_QTX, low_qcoeff, low_dqcoeff,
                            p->dequant_QTX, eob,
                            // default_scan_lp_16x16_transpose and
                            // av1_default_iscan_lp_16x16_transpose have to be
                            // used together.
                            default_scan_lp_16x16_transpose,
                            av1_default_iscan_lp_16x16_transpose);
          }
          break;
        case TX_8X8:
          if (use_hbd) {
            aom_hadamard_8x8(src_diff, diff_stride, coeff);
            av1_quantize_fp(
                coeff, 8 * 8, p->zbin_QTX, p->round_fp_QTX, p->quant_fp_QTX,
                p->quant_shift_QTX, qcoeff, dqcoeff, p->dequant_QTX, eob,
                default_scan_8x8_transpose, av1_default_iscan_8x8_transpose);
          } else {
            if (is_tx_8x8_dual_applicable) {
              // The coeffs are pre-computed for the whole block, so re-assign
              // low_coeff to the appropriate location.
              const int block_offset = BLOCK_OFFSET(block + s);
              low_coeff = (int16_t *)p->coeff + block_offset;
            } else {
              aom_hadamard_lp_8x8(src_diff, diff_stride, low_coeff);
            }
            av1_quantize_lp(
                low_coeff, 8 * 8, p->round_fp_QTX, p->quant_fp_QTX, low_qcoeff,
                low_dqcoeff, p->dequant_QTX, eob,
                // default_scan_8x8_transpose and
                // av1_default_iscan_8x8_transpose have to be used together.
                default_scan_8x8_transpose, av1_default_iscan_8x8_transpose);
          }
          break;
        default:
          assert(tx_size == TX_4X4);
          // In tx_size=4x4 case, aom_fdct4x4 and aom_fdct4x4_lp generate
          // normal coefficients order, so we don't need to change the scan
          // order here.
          if (use_hbd) {
            aom_fdct4x4(src_diff, coeff, diff_stride);
            av1_quantize_fp(coeff, 4 * 4, p->zbin_QTX, p->round_fp_QTX,
                            p->quant_fp_QTX, p->quant_shift_QTX, qcoeff,
                            dqcoeff, p->dequant_QTX, eob, scan_order->scan,
                            scan_order->iscan);
          } else {
            aom_fdct4x4_lp(src_diff, low_coeff, diff_stride);
            av1_quantize_lp(low_coeff, 4 * 4, p->round_fp_QTX, p->quant_fp_QTX,
                            low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                            scan_order->scan, scan_order->iscan);
          }
          break;
#else
        case TX_16X16:
          aom_hadamard_lp_16x16(src_diff, diff_stride, low_coeff);
          av1_quantize_lp(low_coeff, 16 * 16, p->round_fp_QTX, p->quant_fp_QTX,
                          low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                          default_scan_lp_16x16_transpose,
                          av1_default_iscan_lp_16x16_transpose);
          break;
        case TX_8X8:
          if (is_tx_8x8_dual_applicable) {
            // The coeffs are pre-computed for the whole block, so re-assign
            // low_coeff to the appropriate location.
            const int block_offset = BLOCK_OFFSET(block + s);
            low_coeff = (int16_t *)p->coeff + block_offset;
          } else {
            aom_hadamard_lp_8x8(src_diff, diff_stride, low_coeff);
          }
          av1_quantize_lp(low_coeff, 8 * 8, p->round_fp_QTX, p->quant_fp_QTX,
                          low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                          default_scan_8x8_transpose,
                          av1_default_iscan_8x8_transpose);
          break;
        default:
          aom_fdct4x4_lp(src_diff, low_coeff, diff_stride);
          av1_quantize_lp(low_coeff, 4 * 4, p->round_fp_QTX, p->quant_fp_QTX,
                          low_qcoeff, low_dqcoeff, p->dequant_QTX, eob,
                          scan_order->scan, scan_order->iscan);
          break;
#endif
      }
      assert(*eob <= 1024);
#if CONFIG_AV1_HIGHBITDEPTH
      if (use_hbd)
        update_yrd_loop_vars_hbd(x, &temp_skippable, step, *eob, coeff, qcoeff,
                                 dqcoeff, this_rdc, &eob_cost,
                                 r * num_blk_skip_w + c);
      else
#endif
        update_yrd_loop_vars(x, &temp_skippable, step, *eob, low_coeff,
                             low_qcoeff, low_dqcoeff, this_rdc, &eob_cost,
                             r * num_blk_skip_w + c);
    }
    block += row_step;
  }

  this_rdc->skip_txfm = *skippable = temp_skippable;
  if (this_rdc->sse < INT64_MAX) {
    this_rdc->sse = (this_rdc->sse << 6) >> 2;
    if (temp_skippable) {
      this_rdc->dist = 0;
      this_rdc->dist = this_rdc->sse;
      return;
    }
  }

  // If skippable is set, rate gets clobbered later.
  this_rdc->rate <<= (2 + AV1_PROB_COST_SHIFT);
  this_rdc->rate += (eob_cost << AV1_PROB_COST_SHIFT);
}